

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O2

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab,int n_ctx,int n_gpu_layers)

{
  int32_t *piVar1;
  int32_t *piVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *this;
  int iVar3;
  int iVar4;
  uint uVar5;
  mapped_type pgVar6;
  pointer pgVar7;
  void *pvVar8;
  FILE *__stream;
  pointer pcVar9;
  int32_t iVar10;
  _Alloc_hider _Var11;
  uint32_t uVar12;
  char cVar13;
  bool bVar14;
  int iVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ggml_context *pgVar24;
  ggml_backend_buffer_t pgVar25;
  ggml_tensor *pgVar26;
  mapped_type *ppgVar27;
  undefined8 uVar28;
  iterator iVar29;
  ulong uVar30;
  ggml_backend_t pgVar31;
  undefined8 uVar32;
  undefined4 in_register_0000000c;
  pointer pcVar33;
  bool bVar34;
  long lVar35;
  int *piVar36;
  int iVar37;
  int iVar38;
  char *pcVar39;
  undefined4 in_register_00000084;
  int i;
  long lVar40;
  ulong uVar41;
  size_type sVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  gpt2_hparams *hparams;
  uint32_t len;
  uint32_t magic;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  vector<char,_std::allocator<char>_> buf;
  int32_t ne [2];
  int32_t length;
  int32_t n_vocab;
  uint uStack_2c4;
  pointer pcStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  long local_2a0;
  ulong local_298;
  uint32_t local_290;
  int32_t ttype;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  undefined8 uStack_248;
  undefined1 local_240;
  ifstream fin;
  uint auStack_218 [122];
  
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",(fname->_M_dataplus)._M_p,
         CONCAT44(in_register_0000000c,n_ctx),CONCAT44(in_register_00000084,n_gpu_layers));
  std::ifstream::ifstream(&fin,(string *)fname,_S_bin);
  if ((*(byte *)((long)auStack_218 + *(long *)(_fin + -0x18)) & 5) == 0) {
    std::istream::read((char *)&fin,(long)&magic);
    if (magic == 0x67676d6c) {
      local_290 = n_ctx;
      std::istream::read((char *)&fin,(long)model);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_ctx);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_embd);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_head);
      piVar1 = &(model->hparams).n_layer;
      std::istream::read((char *)&fin,(long)piVar1);
      piVar2 = &(model->hparams).ftype;
      std::istream::read((char *)&fin,(long)piVar2);
      iVar15 = (model->hparams).ftype;
      printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_vocab);
      printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_ctx);
      printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_embd);
      printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_head);
      printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_layer);
      printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).ftype);
      printf("%s: qntvr   = %d\n","gpt2_model_load",(long)iVar15 / 1000 & 0xffffffff);
      (model->hparams).ftype = (model->hparams).ftype % 1000;
      _n_vocab = (pointer)((ulong)uStack_2c4 << 0x20);
      std::istream::read((char *)&fin,(long)&n_vocab);
      if (n_vocab != (model->hparams).n_vocab) {
        bVar34 = false;
        fprintf(_stderr,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n",
                "gpt2_model_load",(fname->_M_dataplus)._M_p);
        goto LAB_0010a29a;
      }
      _magic = (pointer)&local_318;
      local_320 = 0;
      local_318._M_local_buf[0] = '\0';
      std::vector<char,_std::allocator<char>_>::vector(&buf,0x80,(allocator_type *)ne);
      iVar15 = 0;
      while( true ) {
        ne[0] = iVar15;
        if (n_vocab <= iVar15) break;
        std::istream::read((char *)&fin,(long)&len);
        std::vector<char,_std::allocator<char>_>::resize(&buf,(ulong)len);
        std::istream::read((char *)&fin,
                           (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        std::__cxx11::string::assign
                  ((char *)&magic,
                   (ulong)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        iVar10 = ne[0];
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&vocab->token_to_id,(key_type *)&magic);
        *pmVar16 = iVar10;
        pmVar17 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&vocab->id_to_token,ne);
        std::__cxx11::string::_M_assign((string *)pmVar17);
        iVar15 = ne[0] + 1;
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buf.super__Vector_base<char,_std::allocator<char>_>);
      std::__cxx11::string::~string((string *)&magic);
      iVar15 = ggml_ftype_to_ggml_type(*piVar2);
      if (iVar15 == 0x27) {
        bVar34 = false;
        fprintf(_stderr,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
                (fname->_M_dataplus)._M_p,(ulong)(uint)*piVar2);
        goto LAB_0010a29a;
      }
      iVar38 = (model->hparams).n_embd;
      lVar35 = (long)iVar38;
      iVar3 = (model->hparams).n_layer;
      iVar37 = (model->hparams).n_ctx;
      iVar4 = (model->hparams).n_vocab;
      lVar18 = ggml_row_size(0,lVar35);
      lVar19 = ggml_row_size(0,lVar35);
      lVar40 = iVar4 * lVar35;
      lVar20 = ggml_row_size(iVar15,lVar40);
      local_2a0 = ggml_row_size(0,iVar37 * lVar35);
      local_298 = ggml_row_size(iVar15,lVar40);
      local_258 = ggml_row_size(0,lVar35);
      local_260 = ggml_row_size(0,lVar35);
      lVar40 = ggml_row_size(0,lVar35);
      local_268 = ggml_row_size(0,lVar35);
      local_270 = ggml_row_size(iVar15,(long)((int)(lVar35 * 3) * iVar38));
      local_278 = ggml_row_size(0,lVar35 * 3);
      local_280 = ggml_row_size(iVar15,iVar38 * iVar38);
      local_288 = ggml_row_size(0,lVar35);
      iVar37 = iVar38 * 4;
      lVar35 = ggml_row_size(iVar15,(long)(iVar37 * iVar38));
      lVar21 = ggml_row_size(0,(long)iVar37);
      lVar22 = ggml_row_size(iVar15,(long)(iVar37 * iVar38));
      lVar23 = ggml_row_size(0,(long)iVar37);
      lVar19 = local_2a0 + local_298 + lVar18 + lVar19 + lVar20 + (long)(iVar3 * 0x600 + 0x300) +
               (lVar22 + lVar23 +
               lVar35 + lVar21 +
               lVar40 + local_268 + local_260 + local_258 + local_278 + local_280 + local_288 +
               local_270) * (long)iVar3;
      printf("%s: ggml tensor size    = %d bytes\n","gpt2_model_load",0x150);
      auVar43._8_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar43._0_8_ = lVar19;
      auVar43._12_4_ = 0x45300000;
      printf("%s: backend buffer size = %6.2f MB\n",
             ((auVar43._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0)) * 9.5367431640625e-07,
             "gpt2_model_load");
      ggml_log_set(ggml_log_callback_default,0);
      iVar38 = *piVar1;
      lVar18 = ggml_tensor_overhead();
      lVar18 = lVar18 * ((long)iVar38 * 0xc + 8);
      uStack_248 = 0;
      local_240 = 1;
      uVar32 = 0;
      local_250 = lVar18;
      pgVar24 = (ggml_context *)ggml_init();
      model->ctx_w = pgVar24;
      if (pgVar24 == (ggml_context *)0x0) {
        pcVar39 = "%s: ggml_init() failed\n";
LAB_0010a28a:
        bVar34 = false;
        fprintf(_stderr,pcVar39,"gpt2_model_load");
      }
      else {
        pgVar31 = model->backend;
        if (pgVar31 == (ggml_backend_t)0x0) {
          fprintf(_stderr,"%s: using CPU backend\n","gpt2_model_load");
          pgVar31 = (ggml_backend_t)ggml_backend_cpu_init();
          model->backend = pgVar31;
          if (pgVar31 == (ggml_backend_t)0x0) {
            pcVar39 = "%s: ggml_backend_cpu_init() failed\n";
            goto LAB_0010a28a;
          }
        }
        pgVar25 = (ggml_backend_buffer_t)ggml_backend_alloc_buffer(pgVar31,lVar19);
        model->buffer_w = pgVar25;
        lVar20 = (long)(model->hparams).n_embd;
        uVar5 = (model->hparams).n_layer;
        iVar38 = (model->hparams).n_ctx;
        lVar19 = (long)(model->hparams).n_vocab;
        std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize
                  (&model->layers,(long)(int)uVar5);
        pgVar26 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar20);
        model->ln_f_g = pgVar26;
        pgVar26 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar20);
        model->ln_f_b = pgVar26;
        pgVar26 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx_w,iVar15,lVar20,lVar19);
        model->wte = pgVar26;
        pgVar26 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx_w,0,lVar20,(long)iVar38);
        model->wpe = pgVar26;
        pgVar26 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx_w,iVar15,lVar20,lVar19);
        model->lm_head = pgVar26;
        pgVar6 = model->ln_f_g;
        local_2a0 = lVar20;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&magic,"model/ln_f/g",(allocator<char> *)&buf);
        this = &model->tensors;
        ppgVar27 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[](this,(key_type *)&magic);
        *ppgVar27 = pgVar6;
        std::__cxx11::string::~string((string *)&magic);
        pgVar6 = model->ln_f_b;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&magic,"model/ln_f/b",(allocator<char> *)&buf);
        ppgVar27 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[](this,(key_type *)&magic);
        *ppgVar27 = pgVar6;
        std::__cxx11::string::~string((string *)&magic);
        pgVar6 = model->wte;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&magic,"model/wte",(allocator<char> *)&buf);
        ppgVar27 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[](this,(key_type *)&magic);
        *ppgVar27 = pgVar6;
        std::__cxx11::string::~string((string *)&magic);
        pgVar6 = model->wpe;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&magic,"model/wpe",(allocator<char> *)&buf);
        ppgVar27 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[](this,(key_type *)&magic);
        *ppgVar27 = pgVar6;
        std::__cxx11::string::~string((string *)&magic);
        pgVar6 = model->lm_head;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&magic,"model/lm_head",(allocator<char> *)&buf);
        ppgVar27 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[](this,(key_type *)&magic);
        *ppgVar27 = pgVar6;
        std::__cxx11::string::~string((string *)&magic);
        lVar19 = local_2a0 * 3;
        lVar20 = (long)((int)local_2a0 * 4);
        if ((int)uVar5 < 1) {
          uVar5 = 0;
        }
        local_298 = (ulong)uVar5;
        lVar40 = 0x58;
        for (uVar41 = 0; uVar12 = local_290, lVar35 = local_2a0, local_298 != uVar41;
            uVar41 = uVar41 + 1) {
          pgVar7 = (model->layers).super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar28 = ggml_new_tensor_1d(model->ctx_w,0,local_2a0);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x58) = uVar28;
          uVar28 = ggml_new_tensor_1d(model->ctx_w,0,lVar35);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x50) = uVar28;
          uVar28 = ggml_new_tensor_1d(model->ctx_w,0,lVar35);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x48) = uVar28;
          uVar28 = ggml_new_tensor_1d(model->ctx_w,0,lVar35);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x40) = uVar28;
          uVar28 = ggml_new_tensor_2d(model->ctx_w,iVar15,lVar35,lVar19);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x38) = uVar28;
          uVar28 = ggml_new_tensor_1d(model->ctx_w,0,lVar19);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x30) = uVar28;
          uVar28 = ggml_new_tensor_2d(model->ctx_w,iVar15,lVar35,lVar35);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x28) = uVar28;
          uVar28 = ggml_new_tensor_1d(model->ctx_w,0,lVar35);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x20) = uVar28;
          uVar28 = ggml_new_tensor_2d(model->ctx_w,iVar15,lVar35,lVar20);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x18) = uVar28;
          uVar28 = ggml_new_tensor_1d(model->ctx_w,0,lVar20);
          *(undefined8 *)((long)pgVar7 + lVar40 + -0x10) = uVar28;
          uVar28 = ggml_new_tensor_2d(model->ctx_w,iVar15,lVar20,lVar35);
          *(undefined8 *)((long)pgVar7 + lVar40 + -8) = uVar28;
          uVar28 = ggml_new_tensor_1d(model->ctx_w,0,lVar35);
          *(undefined8 *)((long)&pgVar7->ln_1_g + lVar40) = uVar28;
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x58);
          iVar38 = (int)uVar41;
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/ln_1/g");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x50);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/ln_1/b");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x48);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/ln_2/g");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x40);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/ln_2/b");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x38);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/attn/c_attn/w");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x30);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/attn/c_attn/b");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x28);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/attn/c_proj/w");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x20);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/attn/c_proj/b");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x18);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/mlp/c_fc/w");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -0x10);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/mlp/c_fc/b");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)pgVar7 + lVar40 + -8);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/mlp/c_proj/w");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          pgVar6 = *(mapped_type *)((long)&pgVar7->ln_1_g + lVar40);
          std::__cxx11::to_string((string *)&n_vocab,iVar38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "model/h",(string *)&n_vocab);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                         "/mlp/c_proj/b");
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&magic);
          *ppgVar27 = pgVar6;
          std::__cxx11::string::~string((string *)&magic);
          std::__cxx11::string::~string((string *)&buf);
          std::__cxx11::string::~string((string *)&n_vocab);
          lVar40 = lVar40 + 0x60;
        }
        (model->hparams).n_ctx = local_290;
        sVar42 = (size_type)(int)local_290;
        uVar41 = (long)(model->hparams).n_layer * sVar42;
        lVar19 = (long)(model->hparams).n_embd * uVar41;
        pgVar26 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar19);
        (model->kv_cache).k = pgVar26;
        pgVar26 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar19);
        (model->kv_cache).v = pgVar26;
        (model->kv_cache).head = 0;
        (model->kv_cache).size = uVar12;
        std::vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>::resize
                  (&(model->kv_cache).cells,sVar42);
        lVar19 = ggml_nbytes((model->kv_cache).k);
        lVar20 = ggml_nbytes((model->kv_cache).v);
        lVar40 = lVar20 + lVar19;
        auVar44._8_4_ = (int)((ulong)lVar40 >> 0x20);
        auVar44._0_8_ = lVar40;
        auVar44._12_4_ = 0x45300000;
        printf("%s: memory size = %8.2f MB, n_mem = %d\n",
               ((auVar44._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar40) - 4503599627370496.0)) * 0.0009765625 *
               0.0009765625,"gpt2_model_load",uVar41 & 0xffffffff);
        pgVar25 = (ggml_backend_buffer_t)
                  ggml_backend_alloc_buffer(model->backend,lVar20 + lVar19 + 0x100);
        (model->kv_cache).buffer = pgVar25;
        ggml_tallocr_new(&magic,pgVar25);
        ggml_tallocr_alloc(&magic,(model->kv_cache).k);
        ggml_tallocr_alloc(&magic,(model->kv_cache).v);
        ggml_tallocr_new(&magic,model->buffer_w);
        local_2b8._M_allocated_capacity = 0;
        _n_vocab = (pointer)0x0;
        pcStack_2c0 = (pointer)0x0;
        lVar19 = 0;
        bVar34 = false;
        while( true ) {
          std::istream::read((char *)&fin,(long)&len);
          std::istream::read((char *)&fin,(long)&length);
          std::istream::read((char *)&fin,(long)&ttype);
          uVar5 = *(uint *)((long)auStack_218 + *(long *)(_fin + -0x18));
          if ((uVar5 & 2) != 0) break;
          ne[0] = 1;
          ne[1] = 1;
          piVar36 = ne;
          iVar15 = 1;
          for (lVar20 = 0; lVar20 < (int)len; lVar20 = lVar20 + 1) {
            std::istream::read((char *)&fin,(long)piVar36);
            iVar15 = iVar15 * *piVar36;
            piVar36 = piVar36 + 1;
          }
          buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct((ulong)&buf,(char)length);
          std::istream::read((char *)&fin,
                             (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
          iVar29 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::find(&this->_M_t,(key_type *)&buf);
          if ((_Rb_tree_header *)iVar29._M_node ==
              &(model->tensors)._M_t._M_impl.super__Rb_tree_header) {
            fprintf(_stderr,"%s: unknown tensor \'%s\' in model file\n","gpt2_model_load",
                    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
LAB_0010a3be:
            std::__cxx11::string::~string((string *)&buf);
            goto LAB_0010a1a7;
          }
          ppgVar27 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[](this,(key_type *)&buf);
          pgVar6 = *ppgVar27;
          ggml_set_name(pgVar6,buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
          lVar20 = ggml_nelements(pgVar6);
          if (lVar20 != iVar15) {
            fprintf(_stderr,"%s: tensor \'%s\' has wrong size in model file\n","gpt2_model_load",
                    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
            goto LAB_0010a3be;
          }
          if ((pgVar6->ne[0] != (long)ne[0]) || (pgVar6->ne[1] != (long)ne[1])) {
            fprintf(_stderr,
                    "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                    ,"gpt2_model_load",
                    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,pgVar6->ne[0],pgVar6->ne[1],
                    CONCAT44((int)((ulong)lVar18 >> 0x20),ne[0]),
                    CONCAT44((int)((ulong)uVar32 >> 0x20),ne[1]));
            goto LAB_0010a3be;
          }
          lVar40 = ggml_type_size(ttype);
          uVar41 = ggml_blck_size(pgVar6->type);
          uVar30 = ggml_nbytes(pgVar6);
          pcVar9 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          __stream = _stderr;
          if ((ulong)(lVar40 * lVar20) / uVar41 != uVar30) {
            uVar32 = ggml_nbytes(pgVar6);
            fprintf(__stream,
                    "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                    "gpt2_model_load",pcVar9,uVar32,lVar40 * lVar20);
            goto LAB_0010a3be;
          }
          ggml_tallocr_alloc(&magic,pgVar6);
          cVar13 = ggml_backend_is_cpu(model->backend);
          if (cVar13 == '\0') {
            sVar42 = ggml_nbytes(pgVar6);
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)&n_vocab,sVar42);
            _Var11._M_p = _n_vocab;
            ggml_nbytes(pgVar6);
            std::istream::read((char *)&fin,(long)_Var11._M_p);
            _Var11._M_p = _n_vocab;
            uVar28 = ggml_nbytes(pgVar6);
            ggml_backend_tensor_set(pgVar6,_Var11._M_p,0,uVar28);
          }
          else {
            pvVar8 = pgVar6->data;
            ggml_nbytes(pgVar6);
            std::istream::read((char *)&fin,(long)pvVar8);
          }
          bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&buf,"model/wte");
          if ((bVar14) && (!bVar34)) {
            model->lm_head = pgVar6;
          }
          bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&buf,"model/lm_head");
          lVar20 = ggml_nbytes(pgVar6);
          if (bVar14) {
            bVar34 = true;
          }
          lVar19 = lVar19 + lVar20;
          std::__cxx11::string::~string((string *)&buf);
        }
        auVar45._8_4_ = (int)((ulong)lVar19 >> 0x20);
        auVar45._0_8_ = lVar19;
        auVar45._12_4_ = 0x45300000;
        printf("%s: model size  = %8.2f MB\n",
               ((auVar45._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0)) * 0.0009765625 *
               0.0009765625,"gpt2_model_load");
LAB_0010a1a7:
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&n_vocab);
        if ((uVar5 & 2) == 0) {
          bVar34 = false;
        }
        else {
          bVar34 = true;
          std::ifstream::close();
        }
      }
      goto LAB_0010a29a;
    }
    pcVar33 = (fname->_M_dataplus)._M_p;
    pcVar39 = "%s: invalid model file \'%s\' (bad magic)\n";
  }
  else {
    pcVar33 = (fname->_M_dataplus)._M_p;
    pcVar39 = "%s: failed to open \'%s\'\n";
  }
  bVar34 = false;
  fprintf(_stderr,pcVar39,"gpt2_model_load",pcVar33);
LAB_0010a29a:
  std::ifstream::~ifstream(&fin);
  return bVar34;
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab, int n_ctx, int n_gpu_layers) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    size_t buffer_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        buffer_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_g
        buffer_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_b

        buffer_size += ggml_row_size(wtype,         n_vocab*n_embd); // wte
        buffer_size += ggml_row_size(GGML_TYPE_F32,   n_ctx*n_embd); // wpe
        buffer_size += ggml_row_size(wtype,         n_vocab*n_embd); // lm_head

        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_g
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_b

        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_g
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_b

        buffer_size += n_layer*(ggml_row_size(wtype,         3*n_embd*n_embd)); // c_attn_attn_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 3*n_embd));        // c_attn_attn_b

        buffer_size += n_layer*(ggml_row_size(wtype,         n_embd*n_embd));   // c_attn_proj_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd));          // c_attn_proj_b

        buffer_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_fc_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_fc_b

        buffer_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_proj_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_proj_b

        buffer_size += (6 + 12*n_layer)*128; // alignment overhead

        printf("%s: ggml tensor size    = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
        printf("%s: backend buffer size = %6.2f MB\n", __func__, buffer_size/(1024.0*1024.0));
    }

    ggml_log_set(ggml_log_callback_default, nullptr);

    // create the ggml context
    {
        size_t n_tensors = 2 + 6 + 12*model.hparams.n_layer;
        struct ggml_init_params params = {
            /*.mem_size   =*/ ggml_tensor_overhead() * n_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (n_gpu_layers > 0) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        model.backend = ggml_backend_cuda_init(0);
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (n_gpu_layers > 0) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        model.backend = ggml_backend_metal_init();
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if (!model.backend) {
        // fallback to CPU backend
        fprintf(stderr, "%s: using CPU backend\n", __func__);
        model.backend = ggml_backend_cpu_init();
    }

    if (!model.backend) {
        fprintf(stderr, "%s: ggml_backend_cpu_init() failed\n", __func__);
        return false;
    }

    // allocate weights buffer
    model.buffer_w = ggml_backend_alloc_buffer(model.backend, buffer_size);

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // override the default training context with the user-provided
    model.hparams.n_ctx = n_ctx;

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.kv_cache.k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.kv_cache.v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        model.kv_cache.head      = 0;
        model.kv_cache.size      = n_ctx;

        model.kv_cache.cells.resize(n_ctx);

        const size_t memory_size = ggml_nbytes(model.kv_cache.k) + ggml_nbytes(model.kv_cache.v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);

        // create a backend buffer (can be in host or device memory)
        model.kv_cache.buffer = ggml_backend_alloc_buffer(model.backend, memory_size + 256);

        // allocate the tensors into the backend buffer
        {
            ggml_tallocr alloc = ggml_tallocr_new(model.kv_cache.buffer);

            // this updates the pointers in the tensors to point to the correct location in the buffer
            // this is necessary since the ggml_context is .no_alloc == true
            // note that the buffer can actually be a device buffer, depending on the backend
            ggml_tallocr_alloc(&alloc, model.kv_cache.k);
            ggml_tallocr_alloc(&alloc, model.kv_cache.v);
        }
    }

    // load weights
    {
        ggml_tallocr alloc = ggml_tallocr_new(model.buffer_w);

        size_t total_size = 0;

        bool has_lm_head = false;

        std::vector<char> read_buf;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            ggml_set_name(tensor, name.c_str());
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            ggml_tallocr_alloc(&alloc, tensor);

            if (ggml_backend_is_cpu  (model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
                ) {
                // for the CPU and Metal backend, we can read directly into the tensor
                fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
            } else {
                // read into a temporary buffer first, then copy to device memory
                read_buf.resize(ggml_nbytes(tensor));
                fin.read(read_buf.data(), ggml_nbytes(tensor));
                ggml_backend_tensor_set(tensor, read_buf.data(), 0, ggml_nbytes(tensor));
            }

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                //ggml_tallocr_alloc(alloc, model.lm_head);
                //ggml_backend_tensor_copy(tensor, model.lm_head);
                model.lm_head = tensor;
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }

        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    return true;
}